

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilut.h
# Opt level: O1

void Mini_LutGrow(Mini_Lut_t *p,int nCapMin)

{
  int *piVar1;
  uint *puVar2;
  byte bVar3;
  size_t sVar4;
  
  if (p->nCap < nCapMin) {
    sVar4 = (long)nCapMin * (long)p->LutSize * 4;
    if (p->pArray == (int *)0x0) {
      piVar1 = (int *)malloc(sVar4);
    }
    else {
      piVar1 = (int *)realloc(p->pArray,sVar4);
    }
    p->pArray = piVar1;
    bVar3 = (char)p->LutSize - 5;
    if (p->LutSize < 6) {
      bVar3 = 0;
    }
    sVar4 = (long)(nCapMin << (bVar3 & 0x1f)) << 2;
    if (p->pTruths == (uint *)0x0) {
      puVar2 = (uint *)malloc(sVar4);
    }
    else {
      puVar2 = (uint *)realloc(p->pTruths,sVar4);
    }
    p->pTruths = puVar2;
    p->nCap = nCapMin;
    if (p->pArray == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/miniaig/minilut.h"
                    ,0x55,"void Mini_LutGrow(Mini_Lut_t *, int)");
    }
    if (puVar2 == (uint *)0x0) {
      __assert_fail("p->pTruths",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/miniaig/minilut.h"
                    ,0x56,"void Mini_LutGrow(Mini_Lut_t *, int)");
    }
  }
  return;
}

Assistant:

static void Mini_LutGrow( Mini_Lut_t * p, int nCapMin )
{
    if ( p->nCap >= nCapMin )
        return;
    p->pArray  = MINI_LUT_REALLOC( int,      p->pArray,  nCapMin * p->LutSize ); 
    p->pTruths = MINI_LUT_REALLOC( unsigned, p->pTruths, nCapMin * Mini_LutWordNum(p->LutSize) ); 
    p->nCap   = nCapMin;
    assert( p->pArray );
    assert( p->pTruths );
}